

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O0

basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>
jsoncons::
json_type_traits<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::pair<bool,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_void>
::to_json(pair<bool,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          *val)

{
  undefined8 extraout_RDX;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> bVar1;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *in_stack_00000008;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000010;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *j;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *n;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *this;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> local_13;
  
  local_13.field_0.boolean_.val_ = false;
  this = &local_13;
  n = in_RDI;
  std::allocator<char>::allocator();
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json(n,this);
  std::allocator<char>::~allocator((allocator<char> *)&local_13);
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::reserve(this,(size_t)n);
  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::push_back<bool_const&>
            (in_stack_00000010,(bool *)in_stack_00000008);
  basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>::
  push_back<std::__cxx11::wstring_const&>(in_stack_00000010,in_stack_00000008);
  bVar1.field_0.int64_.val_ = extraout_RDX;
  bVar1.field_0._0_8_ = in_RDI;
  return (basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>)bVar1.field_0;
}

Assistant:

static Json to_json(const std::pair<T1,T2>& val)
        {
            Json j(json_array_arg);
            j.reserve(2);
            j.push_back(val.first);
            j.push_back(val.second);
            return j;
        }